

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

size_t __thiscall rcg::Buffer::getSize(Buffer *this,uint32_t part)

{
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  bool bVar1;
  void *pvVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  
  bVar1 = this->multipart;
  gentl = &this->gentl;
  pvVar2 = Stream::getHandle(this->parent);
  if (bVar1 == true) {
    uVar3 = anon_unknown_6::getBufferPartValue<unsigned_long>(gentl,pvVar2,this->buffer,part,1);
    return uVar3;
  }
  uVar3 = anon_unknown_6::getBufferValue<unsigned_long>(gentl,pvVar2,this->buffer,1);
  pvVar2 = Stream::getHandle(this->parent);
  uVar4 = anon_unknown_6::getBufferValue<unsigned_long>(gentl,pvVar2,this->buffer,0x12);
  return uVar3 - uVar4;
}

Assistant:

size_t Buffer::getSize(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_DATA_SIZE);
  }
  else
  {
    size_t size=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_SIZE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    return size-offset;
  }
}